

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy_stream_nginx.c
# Opt level: O1

int log_policy_stream_nginx_create(log_policy policy,log_policy_ctor ctor)

{
  long lVar1;
  long lVar2;
  long *instance;
  int iVar3;
  
  lVar1 = *ctor;
  iVar3 = 1;
  if ((lVar1 != 0) && (lVar2 = *(long *)((long)ctor + 8), lVar2 != 0)) {
    instance = (long *)malloc(0x18);
    if (instance != (long *)0x0) {
      *instance = lVar1;
      instance[1] = lVar2;
      *(undefined2 *)(instance + 2) = *(undefined2 *)((long)ctor + 0x10);
      log_policy_instantiate(policy,instance,1);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int log_policy_stream_nginx_create(log_policy policy, const log_policy_ctor ctor)
{
	log_policy_stream_nginx_data nginx_data = NULL;

	const log_policy_stream_nginx_ctor nginx_ctor = ctor;

	if (nginx_ctor->ngx_log_ptr == NULL || nginx_ctor->ngx_error_ptr == NULL)
	{
		return 1;
	}

	nginx_data = malloc(sizeof(struct log_policy_stream_nginx_data_type));

	if (nginx_data == NULL)
	{
		return 1;
	}

	nginx_data->ngx_log_ptr = nginx_ctor->ngx_log_ptr;

	nginx_data->ngx_error_ptr = (log_policy_stream_nginx_error)nginx_ctor->ngx_error_ptr;

	nginx_data->ngx_log_level = nginx_ctor->ngx_log_level;

	log_policy_instantiate(policy, nginx_data, LOG_POLICY_STREAM_NGINX);

	return 0;
}